

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

iterator pybind11::
         make_iterator<(pybind11::return_value_policy)6,__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,long&>
                   (__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> first,
                   __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> last)

{
  type_info *ptVar1;
  class_<pybind11::detail::iterator_state<__gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>,___gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>,_false,_(pybind11::return_value_policy)6>_>
  *pcVar2;
  class_<pybind11::detail::iterator_state<__gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>,___gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>,_false,_(pybind11::return_value_policy)6>_>
  *in_RDX;
  object extraout_RDX;
  handle in_RSI;
  iterator_state<__gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>,___gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>,_false,_(pybind11::return_value_policy)6>
  *in_RDI;
  iterator iVar3;
  iterator *unaff_retaddr;
  undefined8 in_stack_ffffffffffffff78;
  return_value_policy policy;
  handle parent;
  handle local_70 [3];
  undefined1 local_58;
  undefined2 in_stack_ffffffffffffffb8;
  undefined5 in_stack_ffffffffffffffbb;
  type *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  handle this;
  module_local *in_stack_ffffffffffffffd8;
  type_index in_stack_ffffffffffffffe0;
  iterator_state<__gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>,___gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>,_false,_(pybind11::return_value_policy)6>
  *tp;
  
  policy = (return_value_policy)((ulong)in_stack_ffffffffffffff78 >> 0x38);
  parent.m_ptr = (PyObject *)in_RDI;
  tp = in_RDI;
  std::type_index::type_index
            ((type_index *)&stack0xffffffffffffffe0,
             (type_info *)
             &detail::
              iterator_state<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,false,(pybind11::return_value_policy)6>
              ::typeinfo);
  ptVar1 = detail::get_type_info((type_index *)tp,SUB81((ulong)in_RSI.m_ptr >> 0x38,0));
  if (ptVar1 == (type_info *)0x0) {
    this.m_ptr = (PyObject *)0x0;
    handle::handle((handle *)&stack0xffffffffffffffd0);
    module_local::module_local((module_local *)&stack0xffffffffffffffcf,true);
    class_<pybind11::detail::iterator_state<__gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>,___gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>,_false,_(pybind11::return_value_policy)6>_>
    ::class_<pybind11::module_local>
              (in_RDX,in_RSI,(char *)in_stack_ffffffffffffffe0._M_target,in_stack_ffffffffffffffd8);
    pcVar2 = class_<pybind11::detail::iterator_state<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,false,(pybind11::return_value_policy)6>>
             ::
             def<pybind11::make_iterator<(pybind11::return_value_policy)6,__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,long&>(__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>)::_lambda(pybind11::detail::iterator_state<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,false,(pybind11::return_value_policy)6>&)_1_>
                       ((class_<pybind11::detail::iterator_state<__gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>,___gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>,_false,_(pybind11::return_value_policy)6>_>
                         *)this.m_ptr,in_stack_ffffffffffffffc8,(type *)in_stack_ffffffffffffffc0);
    policy = (return_value_policy)((ulong)pcVar2 >> 0x38);
    class_<pybind11::detail::iterator_state<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,false,(pybind11::return_value_policy)6>>
    ::
    def<pybind11::make_iterator<(pybind11::return_value_policy)6,__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,long&>(__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>)::_lambda(pybind11::detail::iterator_state<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,false,(pybind11::return_value_policy)6>&)_2_,pybind11::return_value_policy>
              ((class_<pybind11::detail::iterator_state<__gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>,___gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>,_false,_(pybind11::return_value_policy)6>_>
                *)this.m_ptr,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
               (return_value_policy *)
               CONCAT53(in_stack_ffffffffffffffbb,CONCAT12(6,in_stack_ffffffffffffffb8)));
    class_<pybind11::detail::iterator_state<__gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>,___gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>,_false,_(pybind11::return_value_policy)6>_>
    ::~class_((class_<pybind11::detail::iterator_state<__gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>,___gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>,_false,_(pybind11::return_value_policy)6>_>
               *)0x2d33f7);
  }
  local_58 = 1;
  local_70[0].m_ptr = (PyObject *)0x0;
  handle::handle(local_70);
  cast<pybind11::detail::iterator_state<__gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>,___gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>,_false,_(pybind11::return_value_policy)6>,_0>
            (in_RDI,policy,parent);
  iterator::iterator(unaff_retaddr,(object *)tp);
  object::~object((object *)0x2d3484);
  iVar3.value.super_handle.m_ptr = extraout_RDX.super_handle.m_ptr;
  iVar3.super_object.super_handle.m_ptr = (handle)(handle)parent.m_ptr;
  return iVar3;
}

Assistant:

iterator make_iterator(Iterator first, Sentinel last, Extra &&... extra) {
    using state = detail::iterator_state<Iterator, Sentinel, false, Policy>;

    if (!detail::get_type_info(typeid(state), false)) {
        class_<state>(handle(), "iterator", pybind11::module_local())
            .def("__iter__", [](state &s) -> state& { return s; })
            .def("__next__", [](state &s) -> ValueType {
                if (!s.first_or_done)
                    ++s.it;
                else
                    s.first_or_done = false;
                if (s.it == s.end) {
                    s.first_or_done = true;
                    throw stop_iteration();
                }
                return *s.it;
            }, std::forward<Extra>(extra)..., Policy);
    }

    return cast(state{first, last, true});
}